

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HiResTimer.cpp
# Opt level: O0

double __thiscall PlatformAgnostic::DateTime::HiResTimer::GetSystemTime(HiResTimer *this)

{
  ULONGLONG UVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double currentTime;
  ULONGLONG diff;
  ULONGLONG current;
  HiResTimer *this_local;
  
  UVar1 = GetTickCount64();
  uVar2 = UVar1 - (this->data).cacheTick;
  if (((this->data).previousDifference < uVar2) && (uVar2 < 5)) {
    (this->data).previousDifference = uVar2;
    auVar3._8_4_ = (int)(uVar2 >> 0x20);
    auVar3._0_8_ = uVar2;
    auVar3._12_4_ = 0x45300000;
    this_local = (HiResTimer *)
                 ((this->data).cacheSysTime +
                 (auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  }
  else {
    this_local = (HiResTimer *)GetSystemTimeREAL();
    if (((double)this_local < (this->data).cacheSysTime) ||
       ((this->data).cacheSysTime + 5.0 <= (double)this_local)) {
      (this->data).previousDifference = 0;
      (this->data).cacheSysTime = (double)this_local;
      (this->data).cacheTick = UVar1;
    }
    else {
      (this->data).previousDifference = 0xffffffffffffffff;
      this_local = (HiResTimer *)((this->data).cacheSysTime + 5.0);
    }
  }
  return (double)this_local;
}

Assistant:

double HiResTimer::GetSystemTime()
    {
        ULONGLONG current = GetTickCount64();
        ULONGLONG diff = current - data.cacheTick;

        if (diff <= data.previousDifference || diff >= INTERVAL_FOR_TICK_BACKUP) // max *ms to respond system time changes
        {
            double currentTime = GetSystemTimeREAL();

            // in case the system time wasn't updated backwards, and cache is still beyond...
            if (currentTime >= data.cacheSysTime && currentTime < data.cacheSysTime + INTERVAL_FOR_TICK_BACKUP)
            {
                data.previousDifference = (ULONGLONG) -1; // Make sure next request won't use cache
                return data.cacheSysTime + INTERVAL_FOR_TICK_BACKUP; // wait for real time
            }

            data.previousDifference = 0;
            data.cacheSysTime = currentTime;
            data.cacheTick = current;

            return currentTime;
        }

        // tick count is circular. So, make sure tick wasn't cycled since the last request
        data.previousDifference = diff;
        return data.cacheSysTime + (double)diff;
    }